

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  istream *piVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar7;
  pointer pMVar8;
  reference pvVar9;
  Scalar *pSVar10;
  ostream *poVar11;
  reference pvVar12;
  double dVar13;
  Matrix<double,__1,_1,_0,__1,_1> local_938;
  undefined1 local_928 [8];
  Tools tools;
  float phi;
  float ro_1;
  size_t k;
  size_t N;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ground_truth;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  estimations;
  FusionEKF fusionEKF;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_798;
  Matrix<double,__1,_1,_0,__1,_1> local_778;
  float local_768;
  float local_764;
  float vy_gt;
  float vx_gt;
  float y_gt;
  float x_gt;
  double local_750;
  double local_748;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_740;
  float local_71c;
  float local_718;
  float ro_dot;
  float theta;
  float ro;
  double local_700;
  double local_6f8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_6f0;
  float local_6d0;
  float local_6cc;
  float y;
  float x;
  DenseIndex local_6b8;
  longlong timestamp;
  istringstream iss;
  undefined1 local_530 [8];
  GroundTruthPackage gt_package;
  MeasurementPackage meas_package;
  string sensor_type;
  string local_4d0 [8];
  string line;
  undefined1 local_4b0 [8];
  vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> gt_pack_list;
  vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> measurement_pack_list;
  ofstream out_file_;
  allocator local_279;
  string local_278 [8];
  string out_file_name_;
  ifstream local_258 [8];
  ifstream in_file_;
  allocator local_39;
  string local_38 [8];
  string in_file_name_;
  char **argv_local;
  int argc_local;
  
  check_arguments(argc,argv);
  pcVar5 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar5,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_258,pcVar5,_S_in);
  pcVar5 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,pcVar5,&local_279);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream
            (&measurement_pack_list.
              super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pcVar5,_S_out);
  check_files(local_258,(string *)local_38,
              (ofstream *)
              &measurement_pack_list.
               super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(string *)local_278);
  std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::vector
            ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
             &gt_pack_list.
              super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::vector
            ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)local_4b0);
  std::__cxx11::string::string(local_4d0);
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_258,local_4d0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::string::string
              ((string *)
               &meas_package.raw_measurements_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    MeasurementPackage::MeasurementPackage
              ((MeasurementPackage *)
               &gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                .m_storage.m_rows);
    GroundTruthPackage::GroundTruthPackage((GroundTruthPackage *)local_530);
    std::__cxx11::istringstream::istringstream((istringstream *)&timestamp,local_4d0,_S_in);
    std::operator>>((istream *)&timestamp,
                    (string *)
                    &meas_package.raw_measurements_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   );
    iVar4 = std::__cxx11::string::compare
                      ((char *)&meas_package.raw_measurements_.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
    if (iVar4 == 0) {
      meas_package.timestamp_._0_4_ = 0;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&y,2);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)&meas_package.sensor_type_,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&y);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&y);
      std::istream::operator>>((istream *)&timestamp,&local_6cc);
      std::istream::operator>>((istream *)&timestamp,&local_6d0);
      local_6f8 = (double)local_6cc;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_6f0,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&meas_package.sensor_type_,
                 &local_6f8);
      local_700 = (double)local_6d0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (&local_6f0,&local_700);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_6f0);
      std::istream::operator>>((istream *)&timestamp,&local_6b8);
      gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_rows = local_6b8;
      std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                 &gt_pack_list.
                  super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)
                 &gt_package.gt_values_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)&meas_package.raw_measurements_.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows);
      if (iVar4 == 0) {
        meas_package.timestamp_._0_4_ = 1;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&theta,3);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&meas_package.sensor_type_,
                   (Matrix<double,__1,_1,_0,__1,_1> *)&theta);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&theta);
        std::istream::operator>>((istream *)&timestamp,&ro_dot);
        std::istream::operator>>((istream *)&timestamp,&local_718);
        std::istream::operator>>((istream *)&timestamp,&local_71c);
        local_748 = (double)ro_dot;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                  (&local_740,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&meas_package.sensor_type_,
                   &local_748);
        local_750 = (double)local_718;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (&local_740,&local_750);
        _y_gt = (double)local_71c;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar7,(Scalar *)&y_gt);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                  (&local_740);
        std::istream::operator>>((istream *)&timestamp,&local_6b8);
        gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows = local_6b8;
        std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                  ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                   &gt_pack_list.
                    super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type *)
                   &gt_package.gt_values_.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        ;
      }
    }
    std::istream::operator>>((istream *)&timestamp,&vx_gt);
    std::istream::operator>>((istream *)&timestamp,&vy_gt);
    std::istream::operator>>((istream *)&timestamp,&local_764);
    std::istream::operator>>((istream *)&timestamp,&local_768);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_778,4);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)&gt_package.sensor_type_,&local_778);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_778);
    local_7a0 = (double)vx_gt;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_798,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&gt_package.sensor_type_,
               &local_7a0);
    local_7a8 = (double)vy_gt;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_798,&local_7a8);
    local_7b0 = (double)local_764;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar7,&local_7b0);
    fusionEKF._280_8_ = (BADTYPE)local_768;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar7,(Scalar *)&fusionEKF.noise_ax);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_798);
    std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::push_back
              ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)local_4b0,
               (value_type *)local_530);
    std::__cxx11::istringstream::~istringstream((istringstream *)&timestamp);
    GroundTruthPackage::~GroundTruthPackage((GroundTruthPackage *)local_530);
    MeasurementPackage::~MeasurementPackage
              ((MeasurementPackage *)
               &gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                .m_storage.m_rows);
    std::__cxx11::string::~string
              ((string *)
               &meas_package.raw_measurements_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  }
  FusionEKF::FusionEKF
            ((FusionEKF *)
             &estimations.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)&ground_truth.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)&N);
  pMVar8 = (pointer)std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::size
                              ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                               &gt_pack_list.
                                super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (_phi = (pointer)0x0; _phi < pMVar8;
      _phi = (pointer)((long)&(_phi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                              .m_storage.m_data + 1)) {
    pvVar9 = std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::operator[]
                       ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                        &gt_pack_list.
                         super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)_phi);
    FusionEKF::ProcessMeasurement
              ((FusionEKF *)
               &estimations.
                super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &fusionEKF.ekf_,0);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\t");
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &fusionEKF.ekf_,1);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\t");
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &fusionEKF.ekf_,2);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\t");
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &fusionEKF.ekf_,3);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\t");
    pvVar9 = std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::operator[]
                       ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                        &gt_pack_list.
                         super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)_phi);
    if (pvVar9->sensor_type_ == LASER) {
      pvVar9 = std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::operator[]
                         ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                          &gt_pack_list.
                           super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)_phi);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           &pvVar9->raw_measurements_,0);
      poVar11 = (ostream *)
                std::ostream::operator<<
                          (&measurement_pack_list.
                            super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
      std::operator<<(poVar11,"\t");
      pvVar9 = std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::operator[]
                         ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                          &gt_pack_list.
                           super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)_phi);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           &pvVar9->raw_measurements_,1);
      poVar11 = (ostream *)
                std::ostream::operator<<
                          (&measurement_pack_list.
                            super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
      std::operator<<(poVar11,"\t");
    }
    else {
      pvVar9 = std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::operator[]
                         ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                          &gt_pack_list.
                           super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)_phi);
      if (pvVar9->sensor_type_ == RADAR) {
        pvVar9 = std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::operator[]
                           ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                            &gt_pack_list.
                             super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)_phi);
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &pvVar9->raw_measurements_,0);
        tools._vptr_Tools._4_4_ = (float)*pSVar10;
        pvVar9 = std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::operator[]
                           ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
                            &gt_pack_list.
                             super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)_phi);
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &pvVar9->raw_measurements_,1);
        fVar1 = tools._vptr_Tools._4_4_;
        tools._vptr_Tools._0_4_ = (float)*pSVar10;
        dVar13 = std::cos((double)(ulong)(uint)tools._vptr_Tools._0_4_);
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (&measurement_pack_list.
                              super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             fVar1 * SUB84(dVar13,0));
        std::operator<<(poVar11,"\t");
        fVar1 = tools._vptr_Tools._4_4_;
        dVar13 = std::sin((double)(ulong)(uint)tools._vptr_Tools._0_4_);
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (&measurement_pack_list.
                              super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             fVar1 * SUB84(dVar13,0));
        std::operator<<(poVar11,"\t");
      }
    }
    pvVar12 = std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::operator[]
                        ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)
                         local_4b0,(size_type)_phi);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &pvVar12->gt_values_,0);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\t");
    pvVar12 = std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::operator[]
                        ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)
                         local_4b0,(size_type)_phi);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &pvVar12->gt_values_,1);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\t");
    pvVar12 = std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::operator[]
                        ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)
                         local_4b0,(size_type)_phi);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &pvVar12->gt_values_,2);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\t");
    pvVar12 = std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::operator[]
                        ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)
                         local_4b0,(size_type)_phi);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         &pvVar12->gt_values_,3);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (&measurement_pack_list.
                          super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*pSVar10);
    std::operator<<(poVar11,"\n");
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&ground_truth.
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&fusionEKF.ekf_
               );
    pvVar12 = std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::operator[]
                        ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)
                         local_4b0,(size_type)_phi);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&N,&pvVar12->gt_values_);
  }
  Tools::Tools((Tools *)local_928);
  poVar11 = std::operator<<((ostream *)&std::cout,"Accuracy - RMSE:");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  Tools::CalculateRMSE
            ((Tools *)&local_938,
             (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_928,
             (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&ground_truth.
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar11 = Eigen::operator<<(poVar11,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &local_938);
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_938);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) != 0) {
    std::ofstream::close();
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) != 0) {
    std::ifstream::close();
  }
  Tools::~Tools((Tools *)local_928);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)&N);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)&ground_truth.
                super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FusionEKF::~FusionEKF
            ((FusionEKF *)
             &estimations.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_4d0);
  std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::~vector
            ((vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> *)local_4b0);
  std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::~vector
            ((vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> *)
             &gt_pack_list.
              super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::ofstream::~ofstream
            (&measurement_pack_list.
              super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_278);
  std::ifstream::~ifstream(local_258);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  check_arguments(argc, argv);

  string in_file_name_ = argv[1];
  ifstream in_file_(in_file_name_.c_str(), ifstream::in);

  string out_file_name_ = argv[2];
  ofstream out_file_(out_file_name_.c_str(), ofstream::out);

  check_files(in_file_, in_file_name_, out_file_, out_file_name_);

  vector<MeasurementPackage> measurement_pack_list;
  vector<GroundTruthPackage> gt_pack_list;

  string line;

  // prep the measurement packages (each line represents a measurement at a
  // timestamp)
  while (getline(in_file_, line)) {

    string sensor_type;
    MeasurementPackage meas_package;
    GroundTruthPackage gt_package;
    istringstream iss(line);
    long long timestamp;

    // reads first element from the current line
    iss >> sensor_type;
    if (sensor_type.compare("L") == 0) {
      // LASER MEASUREMENT

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::LASER;
      meas_package.raw_measurements_ = VectorXd(2);
      float x;
      float y;
      iss >> x;
      iss >> y;
      meas_package.raw_measurements_ << x, y;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    } else if (sensor_type.compare("R") == 0) {
      // RADAR MEASUREMENT

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::RADAR;
      meas_package.raw_measurements_ = VectorXd(3);
      float ro;
      float theta;
      float ro_dot;
      iss >> ro;
      iss >> theta;
      iss >> ro_dot;
      meas_package.raw_measurements_ << ro, theta, ro_dot;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    }

    // read ground truth data to compare later
    float x_gt;
    float y_gt;
    float vx_gt;
    float vy_gt;
    iss >> x_gt;
    iss >> y_gt;
    iss >> vx_gt;
    iss >> vy_gt;
    gt_package.gt_values_ = VectorXd(4);
    gt_package.gt_values_ << x_gt, y_gt, vx_gt, vy_gt;
    gt_pack_list.push_back(gt_package);
  }

  // Create a Fusion EKF instance
  FusionEKF fusionEKF;

  // used to compute the RMSE later
  vector<VectorXd> estimations;
  vector<VectorXd> ground_truth;

  //Call the EKF-based fusion
  size_t N = measurement_pack_list.size();
  for (size_t k = 0; k < N; ++k) {
    // start filtering from the second frame (the speed is unknown in the first
    // frame)
    fusionEKF.ProcessMeasurement(measurement_pack_list[k]);

    // output the estimation
    out_file_ << fusionEKF.ekf_.x_(0) << "\t";
    out_file_ << fusionEKF.ekf_.x_(1) << "\t";
    out_file_ << fusionEKF.ekf_.x_(2) << "\t";
    out_file_ << fusionEKF.ekf_.x_(3) << "\t";

    // output the measurements
    if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::LASER) {
      // output the estimation
      out_file_ << measurement_pack_list[k].raw_measurements_(0) << "\t";
      out_file_ << measurement_pack_list[k].raw_measurements_(1) << "\t";
    } else if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::RADAR) {
      // output the estimation in the cartesian coordinates
      float ro = measurement_pack_list[k].raw_measurements_(0);
      float phi = measurement_pack_list[k].raw_measurements_(1);
      out_file_ << ro * cos(phi) << "\t"; // p1_meas
      out_file_ << ro * sin(phi) << "\t"; // ps_meas
    }

    // output the ground truth packages
    out_file_ << gt_pack_list[k].gt_values_(0) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(1) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(2) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(3) << "\n";

    estimations.push_back(fusionEKF.ekf_.x_);
    ground_truth.push_back(gt_pack_list[k].gt_values_);
  }

  // compute the accuracy (RMSE)
  Tools tools;
  cout << "Accuracy - RMSE:" << endl << tools.CalculateRMSE(estimations, ground_truth) << endl;

  // close files
  if (out_file_.is_open()) {
    out_file_.close();
  }

  if (in_file_.is_open()) {
    in_file_.close();
  }

  return 0;
}